

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_hv.c
# Opt level: O3

dtl_av_t * dtl_hv_keys(dtl_hv_t *self)

{
  int32_t iVar1;
  int32_t iVar2;
  dtl_av_t *self_00;
  adt_ary_t *pArray;
  char *cstr;
  dtl_sv_t *dv;
  int s32Index;
  
  if ((self == (dtl_hv_t *)0x0) || (self_00 = dtl_av_new(), self_00 == (dtl_av_t *)0x0)) {
    self_00 = (dtl_av_t *)0x0;
  }
  else {
    pArray = adt_ary_new(free);
    if (pArray != (adt_ary_t *)0x0) {
      iVar1 = adt_hash_keys(self->pAny,pArray);
      if (iVar1 < 1) {
        iVar2 = dtl_av_length(self_00);
        if (iVar2 != iVar1) goto LAB_0013c74d;
      }
      else {
        dtl_av_clear(self_00);
        s32Index = 0;
        do {
          cstr = (char *)adt_ary_value(pArray,s32Index);
          if (cstr == (char *)0x0) {
            __assert_fail("key != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_hv.c"
                          ,0xbc,"dtl_av_t *dtl_hv_keys(const dtl_hv_t *)");
          }
          dv = dtl_sv_make_cstr(cstr);
          dtl_av_push(self_00,(dtl_dv_t *)dv,false);
          s32Index = s32Index + 1;
        } while (iVar1 != s32Index);
        iVar2 = dtl_av_length(self_00);
        if (iVar2 != iVar1) {
LAB_0013c74d:
          __assert_fail("dtl_av_length(array) == numItems",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_hv.c"
                        ,0xc0,"dtl_av_t *dtl_hv_keys(const dtl_hv_t *)");
        }
        if (pArray == (adt_ary_t *)0x0) {
          return self_00;
        }
      }
      adt_ary_delete(pArray);
    }
  }
  return self_00;
}

Assistant:

dtl_av_t* dtl_hv_keys(const dtl_hv_t *self)
{
	if( (self != 0) )
	{
	   dtl_av_t *array = 0;
	   adt_ary_t *tmp = 0; //adt_ary returns a list of cstr (C strings).
	   array = dtl_av_new();
	   if (array != 0)
	   {
	      tmp = adt_ary_new(vfree);
	   }
	   if ( (array != 0) && (tmp != 0) )
	   {
	      int32_t numItems = adt_hash_keys(self->pAny, tmp);
	      if (numItems > 0)
	      {
	         int32_t i;
	         dtl_av_clear(array);
	         for (i=0; i<numItems; i++)
	         {
	            const char *key = (const char *) adt_ary_value(tmp, i);
	            assert(key != 0);
	            dtl_av_push(array, (dtl_dv_t*) dtl_sv_make_cstr(key), false);
	         }
	      }
	      assert(dtl_av_length(array) == numItems);
	   }
	   if (tmp != 0)
	   {
	      adt_ary_delete(tmp);
	   }
	   return array;
	}
	return (dtl_av_t*) 0;
}